

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_Mesh::TransposeSurfaceParameters(ON_Mesh *this)

{
  undefined1 auVar1 [16];
  ON_2dPoint *pOVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  ON_Interval temp;
  
  uVar5 = *(undefined8 *)&this->field_0x240;
  uVar6 = *(undefined8 *)&this->field_0x248;
  *(undefined8 *)&this->field_0x240 = *(undefined8 *)&this->field_0x250;
  *(undefined8 *)&this->field_0x248 = *(undefined8 *)&this->field_0x258;
  *(undefined8 *)&this->field_0x250 = uVar5;
  *(undefined8 *)&this->field_0x258 = uVar6;
  auVar1 = *(undefined1 (*) [16])this->m_srf_scale;
  auVar3._8_4_ = auVar1._0_4_;
  auVar3._0_8_ = auVar1._8_8_;
  auVar3._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])this->m_srf_scale = auVar3;
  lVar7 = (long)(this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
  if (0 < lVar7) {
    pOVar2 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
    lVar8 = 0;
    do {
      auVar1 = *(undefined1 (*) [16])((long)&pOVar2->x + lVar8);
      auVar4._8_4_ = auVar1._0_4_;
      auVar4._0_8_ = auVar1._8_8_;
      auVar4._12_4_ = auVar1._4_4_;
      *(undefined1 (*) [16])((long)&pOVar2->x + lVar8) = auVar4;
      lVar8 = lVar8 + 0x10;
    } while (lVar7 * 0x10 != lVar8);
  }
  return true;
}

Assistant:

bool ON_Mesh::TransposeSurfaceParameters()
{
	// swap m_srf_domain 
	ON_Interval temp = m_srf_domain[0];
	m_srf_domain[0]  = m_srf_domain[1];
	m_srf_domain[1]  = temp;

	double t = m_srf_scale[0];
	m_srf_scale[0] = m_srf_scale[1];
  m_srf_scale[1] = t;

  int S_count = m_S.Count();
  ON_2dPoint* S_array = m_S.Array();
  for (int i = 0; i < S_count; i++ )
  {
    ON_2dPoint& S = S_array[i];
    t = S.x; S.x = S.y; S.y = t;
  }
  return true;
}